

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_context * ggml_init(ggml_init_params params)

{
  long lVar1;
  ggml_context *pgVar2;
  void *pvVar3;
  char *pcVar4;
  int line;
  ulong size;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  size_t in_stack_00000008;
  void *in_stack_00000010;
  undefined1 in_stack_00000018;
  
  ggml_critical_section_start();
  if (ggml_init_is_first_call == '\0') {
    uVar5 = 0;
    uVar6 = 1;
    uVar7 = 2;
    uVar8 = 3;
    lVar1 = 0;
    uVar13 = uVar5;
    uVar14 = uVar6;
    uVar15 = uVar7;
    uVar16 = uVar8;
    uVar9 = uVar5;
    uVar10 = uVar6;
    uVar11 = uVar7;
    uVar12 = uVar8;
    do {
      uVar17 = -(uint)(-0x78000001 < (int)(uVar5 << 0x11 ^ 0x80000000));
      uVar18 = -(uint)(-0x78000001 < (int)(uVar6 << 0x11 ^ 0x80000000));
      uVar19 = -(uint)(-0x78000001 < (int)(uVar7 << 0x11 ^ 0x80000000));
      uVar20 = -(uint)(-0x78000001 < (int)(uVar8 << 0x11 ^ 0x80000000));
      ggml_table_f32_f16[lVar1] =
           (float)((uVar13 & 0x8000) << 0x10 |
                  (uint)((float)((uVar5 << 0x11) >> 4 | 0x70000000) * 1.92593e-34) & uVar17 |
                  ~uVar17 & (uint)((float)(uVar9 & 0x7fff | 0x3f000000) + -0.5));
      ggml_table_f32_f16[lVar1 + 1] =
           (float)((uVar14 & 0x8000) << 0x10 |
                  (uint)((float)((uVar6 << 0x11) >> 4 | 0x70000000) * 1.92593e-34) & uVar18 |
                  ~uVar18 & (uint)((float)(uVar10 & 0x7fff | 0x3f000000) + -0.5));
      ggml_table_f32_f16[lVar1 + 2] =
           (float)((uVar15 & 0x8000) << 0x10 |
                  (uint)((float)((uVar7 << 0x11) >> 4 | 0x70000000) * 1.92593e-34) & uVar19 |
                  ~uVar19 & (uint)((float)(uVar11 & 0x7fff | 0x3f000000) + -0.5));
      ggml_table_f32_f16[lVar1 + 3] =
           (float)((uVar16 & 0x8000) << 0x10 |
                  (uint)((float)((uVar8 << 0x11) >> 4 | 0x70000000) * 1.92593e-34) & uVar20 |
                  ~uVar20 & (uint)((float)(uVar12 & 0x7fff | 0x3f000000) + -0.5));
      lVar1 = lVar1 + 4;
      uVar5 = uVar5 + 4;
      uVar6 = uVar6 + 4;
      uVar7 = uVar7 + 4;
      uVar8 = uVar8 + 4;
      uVar9 = uVar9 + 4;
      uVar10 = uVar10 + 4;
      uVar11 = uVar11 + 4;
      uVar12 = uVar12 + 4;
      uVar13 = uVar13 + 4;
      uVar14 = uVar14 + 4;
      uVar15 = uVar15 + 4;
      uVar16 = uVar16 + 4;
    } while (lVar1 != 0x10000);
    ggml_init_is_first_call = '\x01';
  }
  ggml_critical_section_end();
  pgVar2 = (ggml_context *)malloc(0x28);
  if (pgVar2 != (ggml_context *)0x0) {
    if (in_stack_00000008 == 0) {
      in_stack_00000008 = 0x10;
    }
    size = in_stack_00000008 + 0xf & 0xfffffffffffffff0;
    pvVar3 = in_stack_00000010;
    if (in_stack_00000010 == (void *)0x0) {
      pvVar3 = ggml_aligned_malloc(size);
      in_stack_00000008 = size;
    }
    pgVar2->mem_size = in_stack_00000008;
    pgVar2->mem_buffer = pvVar3;
    pgVar2->mem_buffer_owned = in_stack_00000010 == (void *)0x0;
    pgVar2->no_alloc = (_Bool)in_stack_00000018;
    *(undefined1 (*) [16])&pgVar2->n_objects = (undefined1  [16])0x0;
    *(undefined4 *)((long)&pgVar2->objects_end + 4) = 0;
    if (pvVar3 == (void *)0x0) {
      pcVar4 = "ctx->mem_buffer != NULL";
      line = 0x5b3;
    }
    else {
      if (((ulong)pvVar3 & 0xf) == 0) {
        return pgVar2;
      }
      pcVar4 = "((uintptr_t) (ctx->mem_buffer))%GGML_MEM_ALIGN == 0";
      line = 0x5b5;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,line,"GGML_ASSERT(%s) failed",pcVar4);
  }
  ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %6.2f MB\n",0x3f04000000000000,
                    "ggml_malloc");
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             0x144,"fatal error");
}

Assistant:

struct ggml_context * ggml_init(struct ggml_init_params params) {
    static bool is_first_call = true;

    ggml_critical_section_start();

    if (is_first_call) {
        // initialize time system (required on Windows)
        ggml_time_init();

        for (int i = 0; i < (1 << 16); ++i) {
            union {
                uint16_t u16;
                ggml_fp16_t fp16;
            } u = {i};
            ggml_table_f32_f16[i] = GGML_COMPUTE_FP16_TO_FP32(u.fp16);
        }

        is_first_call = false;
    }

    ggml_critical_section_end();

    struct ggml_context * ctx = GGML_MALLOC(sizeof(struct ggml_context));

    // allow to call ggml_init with 0 size
    if (params.mem_size == 0) {
        params.mem_size = GGML_MEM_ALIGN;
    }

    const size_t mem_size = params.mem_buffer ? params.mem_size : GGML_PAD(params.mem_size, GGML_MEM_ALIGN);

    *ctx = (struct ggml_context) {
        /*.mem_size           =*/ mem_size,
        /*.mem_buffer         =*/ params.mem_buffer ? params.mem_buffer : ggml_aligned_malloc(mem_size),
        /*.mem_buffer_owned   =*/ params.mem_buffer ? false : true,
        /*.no_alloc           =*/ params.no_alloc,
        /*.n_objects          =*/ 0,
        /*.objects_begin      =*/ NULL,
        /*.objects_end        =*/ NULL,
    };

    GGML_ASSERT(ctx->mem_buffer != NULL);

    GGML_ASSERT_ALIGNED(ctx->mem_buffer);

    GGML_PRINT_DEBUG("%s: context initialized\n", __func__);

    return ctx;
}